

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Text.cpp
# Opt level: O1

void __thiscall Text::_drawList(Text *this)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  pointer paVar4;
  ulong uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  
  (*glad_glEnable)(0xde1);
  (*glad_glBindTexture)(0xde1,(this->_texture).id);
  if ((this->text)._M_string_length != 0) {
    fVar7 = this->x;
    fVar9 = this->y;
    uVar5 = 0;
    do {
      sVar3 = (this->_font).glyphs_count;
      if (sVar3 != 0) {
        paVar4 = (this->_font).glyphs.
                 super__Vector_base<texture_glyph_t,_std::allocator<texture_glyph_t>_>._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          if (paVar4->charcode == (int)(this->text)._M_dataplus._M_p[uVar5]) goto LAB_0012c527;
          paVar4 = paVar4 + 1;
          sVar3 = sVar3 - 1;
        } while (sVar3 != 0);
      }
      paVar4 = (pointer)0x0;
LAB_0012c527:
      if (paVar4 != (pointer)0x0) {
        fVar10 = (float)paVar4->offset_x + fVar7 + this->kerning;
        iVar1 = paVar4->width;
        fVar11 = (float)paVar4->offset_y + fVar9;
        iVar2 = paVar4->height;
        (*glad_glBegin)(4);
        (*glad_glColor4f)(1.0,1.0,1.0,1.0);
        (*glad_glTexCoord2f)(paVar4->s0,paVar4->t0);
        (*glad_glVertex3f)(fVar10,fVar11,this->z);
        (*glad_glTexCoord2f)(paVar4->s0,paVar4->t1);
        fVar8 = fVar11 - (float)iVar2;
        (*glad_glVertex3f)(fVar10,fVar8,this->z);
        (*glad_glTexCoord2f)(paVar4->s1,paVar4->t1);
        fVar6 = (float)iVar1 + fVar10;
        (*glad_glVertex3f)(fVar6,fVar8,this->z);
        (*glad_glTexCoord2f)(paVar4->s0,paVar4->t0);
        (*glad_glVertex3f)(fVar10,fVar11,this->z);
        (*glad_glTexCoord2f)(paVar4->s1,paVar4->t1);
        (*glad_glVertex3f)(fVar6,fVar8,this->z);
        (*glad_glTexCoord2f)(paVar4->s1,paVar4->t0);
        (*glad_glVertex3f)(fVar6,fVar11,this->z);
        (*glad_glEnd)();
        fVar7 = fVar7 + paVar4->advance_x;
        fVar9 = fVar9 + paVar4->advance_y;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < (this->text)._M_string_length);
  }
  (*glad_glDisable)(0xde1);
  return;
}

Assistant:

void Text::_drawList() {
    glEnable(GL_TEXTURE_2D);
    glBindTexture(GL_TEXTURE_2D, _texture.id);

    size_t i, j;
    float ix = x, iy = y;
    for(i = 0; i < text.length(); ++i) {
        // Find the glyph
        texture_glyph_t* glyph = 0;
        for(j = 0; j < _font.glyphs_count; ++j) {
            if (_font.glyphs[j].charcode == text[i]) {
                glyph = &_font.glyphs[j];
                break;
            }
        }
        if(!glyph) {
            continue;
        }

        // // Try to dynamically add kerning (NOT WORKING)
        //float k = 0;
        // if (i > 0) {
        //     for (j = 0; j < glyph->kerning_count; ++j) {
        //         //DEBUG_PRINTLN("text[i]: %s text[i-1]: %s", &text[i], &text[i-1]);
        //         if (glyph->kerning[j].codepoint == text[i-1]) {
        //             k = glyph->kerning[j].kerning;
        //             //DEBUG_PRINTLN("text[i]: %d text[i+1]: %d k: %f", &text[i], &text[i-1], k);
        //             break;
        //         }
        //     }
        // }

        // Calculate the size and location based on the current character's glyph
        float ox = ix + glyph->offset_x + kerning;
        float oy = iy + glyph->offset_y;
        float w  = (float)glyph->width;
        float h  = (float)glyph->height;
        
        // Draw the letter
        glBegin(GL_TRIANGLES);
        glColor4f(1.0, 1.0, 1.0, 1.0);
        glTexCoord2f(glyph->s0, glyph->t0); glVertex3f(ox,     oy    , z);
        glTexCoord2f(glyph->s0, glyph->t1); glVertex3f(ox,     oy - h, z);
        glTexCoord2f(glyph->s1, glyph->t1); glVertex3f(ox + w, oy - h, z);
        glTexCoord2f(glyph->s0, glyph->t0); glVertex3f(ox,     oy    , z);
        glTexCoord2f(glyph->s1, glyph->t1); glVertex3f(ox + w, oy - h, z);
        glTexCoord2f(glyph->s1, glyph->t0); glVertex3f(ox + w, oy    , z);
        glEnd();
        
        // Advance to the next letter's position
        ix += glyph->advance_x;
        iy += glyph->advance_y;
    }

    glDisable(GL_TEXTURE_2D);
}